

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *p_tcd,opj_image_t *p_output_image)

{
  byte bVar1;
  uint uVar2;
  opj_image_t *poVar3;
  opj_tcd_resolution_t *poVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  OPJ_INT32 *pOVar9;
  long lVar10;
  opj_image_comp_t *poVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  opj_tcd_resolution_t *poVar16;
  OPJ_UINT32 *pOVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  opj_image_comp_t *poVar21;
  long lVar22;
  uint uVar23;
  OPJ_UINT32 *pOVar24;
  uint uVar25;
  void *__src;
  uint uVar26;
  int iVar27;
  opj_tcd_tilecomp_t *poVar28;
  uint uVar29;
  long lVar30;
  
  poVar3 = p_tcd->image;
  if (poVar3->numcomps != 0) {
    poVar11 = p_output_image->comps;
    poVar21 = poVar3->comps;
    poVar28 = p_tcd->tcd_image->tiles->comps;
    uVar8 = 0;
    do {
      poVar11->resno_decoded = poVar21->resno_decoded;
      poVar4 = poVar28->resolutions;
      poVar16 = poVar4 + poVar21->resno_decoded;
      if (p_tcd->whole_tile_decoding == 0) {
        uVar12 = poVar16->win_x0;
        uVar15 = poVar16->win_x1;
        pOVar24 = &poVar16->win_y0;
        pOVar17 = &poVar16->win_y1;
        uVar6 = uVar15 - uVar12;
        lVar10 = 0x50;
      }
      else {
        uVar12 = poVar16->x0;
        uVar15 = poVar16->x1;
        pOVar24 = (OPJ_UINT32 *)&poVar16->y0;
        pOVar17 = (OPJ_UINT32 *)&poVar16->y1;
        uVar6 = poVar28->minimum_num_resolutions - 1;
        uVar6 = poVar4[uVar6].x1 - poVar4[uVar6].x0;
        lVar10 = 0x30;
      }
      lVar10 = *(long *)((long)&poVar28->x0 + lVar10);
      bVar5 = false;
      if (lVar10 != 0) {
        bVar1 = (byte)poVar11->factor;
        lVar22 = 1L << (bVar1 & 0x3f);
        if ((int)uVar12 < 0) {
          __assert_fail("res_x0 >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0x2390,"OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *, opj_image_t *)");
        }
        if ((int)uVar15 < 0) {
          __assert_fail("res_x1 >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/j2k.c"
                        ,0x2391,"OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t *, opj_image_t *)");
        }
        uVar26 = uVar15 - uVar12;
        uVar2 = poVar11->w;
        uVar19 = (uint)((lVar22 + (ulong)poVar11->x0) - 1 >> (bVar1 & 0x3f));
        uVar29 = uVar2 + uVar19;
        uVar23 = uVar12 - uVar19;
        if (uVar12 < uVar19 || uVar23 == 0) {
          uVar19 = uVar19 - uVar12;
          iVar27 = uVar15 - uVar29;
          if (uVar15 < uVar29 || iVar27 == 0) {
            uVar26 = uVar26 - uVar19;
            uVar23 = 0;
            goto LAB_00119108;
          }
          uVar23 = 0;
          uVar26 = uVar2;
        }
        else {
          uVar19 = 0;
          if (uVar29 < uVar15) {
            iVar27 = uVar26 - (uVar29 - uVar12);
            uVar26 = uVar29 - uVar12;
          }
          else {
LAB_00119108:
            iVar27 = 0;
          }
        }
        uVar12 = *pOVar17;
        uVar15 = *pOVar24;
        uVar13 = uVar12 - uVar15;
        uVar29 = poVar11->h;
        uVar20 = (uint)((lVar22 + (ulong)poVar11->y0) - 1 >> (bVar1 & 0x3f));
        uVar25 = uVar29 + uVar20;
        uVar7 = uVar15 - uVar20;
        if (uVar15 < uVar20 || uVar7 == 0) {
          uVar20 = uVar20 - uVar15;
          iVar14 = uVar12 - uVar25;
          if (uVar12 < uVar25 || iVar14 == 0) {
            uVar13 = uVar13 - uVar20;
            uVar7 = 0;
            goto LAB_0011914e;
          }
          uVar7 = 0;
          uVar13 = uVar29;
        }
        else {
          uVar20 = 0;
          if (uVar25 < uVar12) {
            iVar14 = uVar13 - (uVar25 - uVar15);
            uVar13 = uVar25 - uVar15;
          }
          else {
LAB_0011914e:
            iVar14 = 0;
          }
        }
        if ((((((int)uVar19 < 0) || ((int)uVar20 < 0)) || (iVar27 < 0)) ||
            ((iVar14 < 0 || ((int)uVar26 < 0)))) || ((int)uVar13 < 0)) {
LAB_0011920c:
          bVar5 = true;
        }
        else {
          lVar22 = (ulong)uVar20 * (ulong)uVar6 + (ulong)uVar19;
          lVar30 = (ulong)uVar7 * (ulong)uVar2 + (ulong)uVar23;
          if (((poVar11->data == (OPJ_INT32 *)0x0) && (lVar22 == 0)) &&
             ((lVar30 == 0 && (((uVar6 == uVar2 && (uVar26 == uVar2)) && (uVar13 == uVar29)))))) {
            uVar18 = (ulong)(p_tcd->whole_tile_decoding == 0);
            poVar11->data = (&poVar28->data)[uVar18 * 4];
            (&poVar28->data)[uVar18 * 4] = (OPJ_INT32 *)0x0;
            bVar5 = false;
          }
          else {
            if (poVar11->data == (OPJ_INT32 *)0x0) {
              if ((uVar29 == 0) || (uVar18 = (ulong)uVar29 * (ulong)uVar2, uVar18 >> 0x3e != 0))
              goto LAB_0011920c;
              pOVar9 = (OPJ_INT32 *)opj_image_data_alloc(uVar18 * 4);
              poVar11->data = pOVar9;
              bVar5 = true;
              if (pOVar9 == (OPJ_INT32 *)0x0) goto LAB_00119211;
              if ((poVar11->w != uVar26) || (poVar11->h != uVar13)) {
                memset(pOVar9,0,(ulong)poVar11->w * (ulong)poVar11->h * 4);
              }
            }
            bVar5 = false;
            if (uVar13 != 0) {
              pOVar9 = poVar11->data + lVar30;
              __src = (void *)(lVar10 + lVar22 * 4);
              do {
                memcpy(pOVar9,__src,(ulong)uVar26 << 2);
                pOVar9 = pOVar9 + poVar11->w;
                __src = (void *)((long)__src + (ulong)uVar6 * 4);
                uVar13 = uVar13 - 1;
              } while (uVar13 != 0);
              bVar5 = false;
            }
          }
        }
      }
LAB_00119211:
      if (bVar5) {
        return 0;
      }
      uVar8 = uVar8 + 1;
      poVar11 = poVar11 + 1;
      poVar21 = poVar21 + 1;
      poVar28 = poVar28 + 1;
    } while (uVar8 < poVar3->numcomps);
  }
  return 1;
}

Assistant:

static OPJ_BOOL opj_j2k_update_image_data(opj_tcd_t * p_tcd,
        opj_image_t* p_output_image)
{
    OPJ_UINT32 i, j;
    OPJ_UINT32 l_width_src, l_height_src;
    OPJ_UINT32 l_width_dest, l_height_dest;
    OPJ_INT32 l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src;
    OPJ_SIZE_T l_start_offset_src;
    OPJ_UINT32 l_start_x_dest, l_start_y_dest;
    OPJ_UINT32 l_x0_dest, l_y0_dest, l_x1_dest, l_y1_dest;
    OPJ_SIZE_T l_start_offset_dest;

    opj_image_comp_t * l_img_comp_src = 00;
    opj_image_comp_t * l_img_comp_dest = 00;

    opj_tcd_tilecomp_t * l_tilec = 00;
    opj_image_t * l_image_src = 00;
    OPJ_INT32 * l_dest_ptr;

    l_tilec = p_tcd->tcd_image->tiles->comps;
    l_image_src = p_tcd->image;
    l_img_comp_src = l_image_src->comps;

    l_img_comp_dest = p_output_image->comps;

    for (i = 0; i < l_image_src->numcomps;
            i++, ++l_img_comp_dest, ++l_img_comp_src,  ++l_tilec) {
        OPJ_INT32 res_x0, res_x1, res_y0, res_y1;
        OPJ_UINT32 src_data_stride;
        const OPJ_INT32* p_src_data;

        /* Copy info from decoded comp image to output image */
        l_img_comp_dest->resno_decoded = l_img_comp_src->resno_decoded;

        if (p_tcd->whole_tile_decoding) {
            opj_tcd_resolution_t* l_res = l_tilec->resolutions +
                                          l_img_comp_src->resno_decoded;
            res_x0 = l_res->x0;
            res_y0 = l_res->y0;
            res_x1 = l_res->x1;
            res_y1 = l_res->y1;
            src_data_stride = (OPJ_UINT32)(
                                  l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x1 -
                                  l_tilec->resolutions[l_tilec->minimum_num_resolutions - 1].x0);
            p_src_data = l_tilec->data;
        } else {
            opj_tcd_resolution_t* l_res = l_tilec->resolutions +
                                          l_img_comp_src->resno_decoded;
            res_x0 = (OPJ_INT32)l_res->win_x0;
            res_y0 = (OPJ_INT32)l_res->win_y0;
            res_x1 = (OPJ_INT32)l_res->win_x1;
            res_y1 = (OPJ_INT32)l_res->win_y1;
            src_data_stride = l_res->win_x1 - l_res->win_x0;
            p_src_data = l_tilec->data_win;
        }

        if (p_src_data == NULL) {
            /* Happens for partial component decoding */
            continue;
        }

        l_width_src = (OPJ_UINT32)(res_x1 - res_x0);
        l_height_src = (OPJ_UINT32)(res_y1 - res_y0);


        /* Current tile component size*/
        /*if (i == 0) {
        fprintf(stdout, "SRC: l_res_x0=%d, l_res_x1=%d, l_res_y0=%d, l_res_y1=%d\n",
                        res_x0, res_x1, res_y0, res_y1);
        }*/


        /* Border of the current output component*/
        l_x0_dest = opj_uint_ceildivpow2(l_img_comp_dest->x0, l_img_comp_dest->factor);
        l_y0_dest = opj_uint_ceildivpow2(l_img_comp_dest->y0, l_img_comp_dest->factor);
        l_x1_dest = l_x0_dest +
                    l_img_comp_dest->w; /* can't overflow given that image->x1 is uint32 */
        l_y1_dest = l_y0_dest + l_img_comp_dest->h;

        /*if (i == 0) {
        fprintf(stdout, "DEST: l_x0_dest=%d, l_x1_dest=%d, l_y0_dest=%d, l_y1_dest=%d (%d)\n",
                        l_x0_dest, l_x1_dest, l_y0_dest, l_y1_dest, l_img_comp_dest->factor );
        }*/

        /*-----*/
        /* Compute the area (l_offset_x0_src, l_offset_y0_src, l_offset_x1_src, l_offset_y1_src)
         * of the input buffer (decoded tile component) which will be move
         * in the output buffer. Compute the area of the output buffer (l_start_x_dest,
         * l_start_y_dest, l_width_dest, l_height_dest)  which will be modified
         * by this input area.
         * */
        assert(res_x0 >= 0);
        assert(res_x1 >= 0);
        if (l_x0_dest < (OPJ_UINT32)res_x0) {
            l_start_x_dest = (OPJ_UINT32)res_x0 - l_x0_dest;
            l_offset_x0_src = 0;

            if (l_x1_dest >= (OPJ_UINT32)res_x1) {
                l_width_dest = l_width_src;
                l_offset_x1_src = 0;
            } else {
                l_width_dest = l_x1_dest - (OPJ_UINT32)res_x0 ;
                l_offset_x1_src = (OPJ_INT32)(l_width_src - l_width_dest);
            }
        } else {
            l_start_x_dest = 0U;
            l_offset_x0_src = (OPJ_INT32)l_x0_dest - res_x0;

            if (l_x1_dest >= (OPJ_UINT32)res_x1) {
                l_width_dest = l_width_src - (OPJ_UINT32)l_offset_x0_src;
                l_offset_x1_src = 0;
            } else {
                l_width_dest = l_img_comp_dest->w ;
                l_offset_x1_src = res_x1 - (OPJ_INT32)l_x1_dest;
            }
        }

        if (l_y0_dest < (OPJ_UINT32)res_y0) {
            l_start_y_dest = (OPJ_UINT32)res_y0 - l_y0_dest;
            l_offset_y0_src = 0;

            if (l_y1_dest >= (OPJ_UINT32)res_y1) {
                l_height_dest = l_height_src;
                l_offset_y1_src = 0;
            } else {
                l_height_dest = l_y1_dest - (OPJ_UINT32)res_y0 ;
                l_offset_y1_src = (OPJ_INT32)(l_height_src - l_height_dest);
            }
        } else {
            l_start_y_dest = 0U;
            l_offset_y0_src = (OPJ_INT32)l_y0_dest - res_y0;

            if (l_y1_dest >= (OPJ_UINT32)res_y1) {
                l_height_dest = l_height_src - (OPJ_UINT32)l_offset_y0_src;
                l_offset_y1_src = 0;
            } else {
                l_height_dest = l_img_comp_dest->h ;
                l_offset_y1_src = res_y1 - (OPJ_INT32)l_y1_dest;
            }
        }

        if ((l_offset_x0_src < 0) || (l_offset_y0_src < 0) || (l_offset_x1_src < 0) ||
                (l_offset_y1_src < 0)) {
            return OPJ_FALSE;
        }
        /* testcase 2977.pdf.asan.67.2198 */
        if ((OPJ_INT32)l_width_dest < 0 || (OPJ_INT32)l_height_dest < 0) {
            return OPJ_FALSE;
        }
        /*-----*/

        /* Compute the input buffer offset */
        l_start_offset_src = (OPJ_SIZE_T)l_offset_x0_src + (OPJ_SIZE_T)l_offset_y0_src
                             * (OPJ_SIZE_T)src_data_stride;

        /* Compute the output buffer offset */
        l_start_offset_dest = (OPJ_SIZE_T)l_start_x_dest + (OPJ_SIZE_T)l_start_y_dest
                              * (OPJ_SIZE_T)l_img_comp_dest->w;

        /* Allocate output component buffer if necessary */
        if (l_img_comp_dest->data == NULL &&
                l_start_offset_src == 0 && l_start_offset_dest == 0 &&
                src_data_stride == l_img_comp_dest->w &&
                l_width_dest == l_img_comp_dest->w &&
                l_height_dest == l_img_comp_dest->h) {
            /* If the final image matches the tile buffer, then borrow it */
            /* directly to save a copy */
            if (p_tcd->whole_tile_decoding) {
                l_img_comp_dest->data = l_tilec->data;
                l_tilec->data = NULL;
            } else {
                l_img_comp_dest->data = l_tilec->data_win;
                l_tilec->data_win = NULL;
            }
            continue;
        } else if (l_img_comp_dest->data == NULL) {
            OPJ_SIZE_T l_width = l_img_comp_dest->w;
            OPJ_SIZE_T l_height = l_img_comp_dest->h;

            if ((l_height == 0U) || (l_width > (SIZE_MAX / l_height)) ||
                    l_width * l_height > SIZE_MAX / sizeof(OPJ_INT32)) {
                /* would overflow */
                return OPJ_FALSE;
            }
            l_img_comp_dest->data = (OPJ_INT32*) opj_image_data_alloc(l_width * l_height *
                                    sizeof(OPJ_INT32));
            if (! l_img_comp_dest->data) {
                return OPJ_FALSE;
            }

            if (l_img_comp_dest->w != l_width_dest ||
                    l_img_comp_dest->h != l_height_dest) {
                memset(l_img_comp_dest->data, 0,
                       (OPJ_SIZE_T)l_img_comp_dest->w * l_img_comp_dest->h * sizeof(OPJ_INT32));
            }
        }

        /* Move the output buffer to the first place where we will write*/
        l_dest_ptr = l_img_comp_dest->data + l_start_offset_dest;

        {
            const OPJ_INT32 * l_src_ptr = p_src_data;
            l_src_ptr += l_start_offset_src;

            for (j = 0; j < l_height_dest; ++j) {
                memcpy(l_dest_ptr, l_src_ptr, l_width_dest * sizeof(OPJ_INT32));
                l_dest_ptr += l_img_comp_dest->w;
                l_src_ptr += src_data_stride;
            }
        }


    }

    return OPJ_TRUE;
}